

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_init_aarch64(CPUState *cpu)

{
  undefined4 *puVar1;
  void *pvVar2;
  int64_t iVar3;
  gpointer pvVar4;
  undefined8 *puVar5;
  long lVar6;
  
  pvVar2 = cpu->env_ptr;
  iVar3 = get_clock_realtime();
  *(undefined2 *)((long)pvVar2 + -0x2190) = 0;
  puVar5 = (undefined8 *)((long)pvVar2 + -200);
  for (lVar6 = -0x2170; lVar6 != -0xd0; lVar6 = lVar6 + 0x2b8) {
    puVar1 = (undefined4 *)((long)pvVar2 + lVar6);
    *(int64_t *)(puVar1 + 4) = iVar3;
    *(undefined1 (*) [16])(puVar1 + 6) = (undefined1  [16])0x0;
    puVar5[-1] = 0x3fc0;
    pvVar4 = g_malloc(0x4000);
    *puVar5 = pvVar4;
    pvVar4 = g_malloc(0x1000);
    *(gpointer *)(puVar1 + 0xac) = pvVar4;
    *(undefined1 (*) [16])(puVar1 + 8) = (undefined1  [16])0x0;
    *puVar1 = 0xffffffff;
    puVar1[1] = 0xffffffff;
    puVar1[2] = 0xffffffff;
    puVar1[3] = 0xffffffff;
    memset((void *)*puVar5,0xff,puVar5[-1] + 0x40);
    memset(puVar1 + 0xc,0xff,0x200);
    puVar5 = puVar5 + 2;
  }
  return;
}

Assistant:

void tlb_init(CPUState *cpu)
{
    CPUArchState *env = cpu->env_ptr;
    int64_t now = get_clock_realtime();
    int i;

    /* All tlbs are initialized flushed. */
    env_tlb(env)->c.dirty = 0;

    for (i = 0; i < NB_MMU_MODES; i++) {
        tlb_mmu_init(&env_tlb(env)->d[i], &env_tlb(env)->f[i], now);
    }
}